

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

bool __thiscall QtMWidgets::DateTimeParser::parseFormat(DateTimeParser *this,QString *fmt)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  qsizetype qVar4;
  reference pSVar5;
  qsizetype qVar6;
  QMessageLogger local_310;
  QMessageLogger local_2f0;
  undefined1 local_2d0 [8];
  Section s_6;
  Type t_3;
  int count_5;
  undefined1 local_278 [8];
  Section s_5;
  Type t_2;
  int count_4;
  QMessageLogger local_220;
  undefined1 local_200 [8];
  Section s_4;
  Type t_1;
  int count_3;
  undefined1 local_1a8 [8];
  Section s_3;
  undefined1 local_158 [8];
  Section s_2;
  int count_2;
  undefined1 local_100 [8];
  Section s_1;
  int count_1;
  undefined1 local_a8 [8];
  Section s;
  Type t;
  int count;
  QChar local_5e;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  QVector<Section> newSections;
  int yearSectIndex;
  int monthSectIndex;
  int daySectIndex;
  int hourSectIndex;
  int minuteSectIndex;
  int secondSectIndex;
  int amPmSectIndex;
  int max;
  QString *fmt_local;
  DateTimeParser *this_local;
  
  bVar1 = QString::isEmpty(fmt);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = ::operator==(fmt,&this->format);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      qVar4 = QString::size(fmt);
      minuteSectIndex = -1;
      hourSectIndex = -1;
      daySectIndex = -1;
      monthSectIndex = -1;
      yearSectIndex = -1;
      newSections.d.size._4_4_ = -1;
      newSections.d.size._0_4_ = -1;
      QList<QtMWidgets::Section>::QList((QList<QtMWidgets::Section> *)local_58);
      for (local_5c = 0; local_5c < (int)qVar4; local_5c = local_5c + 1) {
        local_5e = QString::at(fmt,(long)local_5c);
        cVar2 = QChar::toLatin1(&local_5e);
        if (cVar2 != ' ') {
          if (cVar2 == 'M') {
            if (this->type != QTime) {
              s_5.offset = countRepeat(fmt,local_5c,4);
              s_5.currentIndex = 0x100;
              if (s_5.offset == 3) {
                s_5.currentIndex = 0x200;
              }
              else if (s_5.offset == 4) {
                s_5.currentIndex = 0x400;
              }
              Section::Section((Section *)local_278,s_5.currentIndex);
              local_278[4] = -(s_5.offset == 2) & 1;
              local_5c = s_5.offset + -1 + local_5c;
              bVar1 = newSections.d.size._4_4_ != -1;
              if (bVar1) {
                QMessageLogger::QMessageLogger((QMessageLogger *)&t_3,(char *)0x0,0,(char *)0x0);
                QMessageLogger::warning
                          ((char *)&t_3,"DateTimeParser: redefinition of the monthes section.");
                this_local._7_1_ = 0;
              }
              else {
                qVar6 = QList<QtMWidgets::Section>::size((QList<QtMWidgets::Section> *)local_58);
                newSections.d.size._4_4_ = (int)qVar6;
                QList<QtMWidgets::Section>::append
                          ((QList<QtMWidgets::Section> *)local_58,(parameter_type)local_278);
              }
              s_1.offset = (int)bVar1;
              Section::~Section((Section *)local_278);
joined_r0x001f9e6f:
              if (s_1.offset != 0) goto LAB_001f9eff;
            }
          }
          else if (cVar2 == 'a') {
            if (this->type != QDate) {
              Section::Section((Section *)local_1a8,AmPmSection);
              if (monthSectIndex != -1) {
                pSVar5 = QList<QtMWidgets::Section>::operator[]
                                   ((QList<QtMWidgets::Section> *)local_58,(long)monthSectIndex);
                pSVar5->type = Hour12Section;
              }
              bVar1 = minuteSectIndex != -1;
              if (bVar1) {
                QMessageLogger::QMessageLogger((QMessageLogger *)&t_1,(char *)0x0,0,(char *)0x0);
                QMessageLogger::warning
                          ((char *)&t_1,"DateTimeParser: redefinition of the AM/PM section.");
                this_local._7_1_ = 0;
              }
              else {
                qVar6 = QList<QtMWidgets::Section>::size((QList<QtMWidgets::Section> *)local_58);
                minuteSectIndex = (int)qVar6;
                QList<QtMWidgets::Section>::append
                          ((QList<QtMWidgets::Section> *)local_58,(parameter_type)local_1a8);
              }
              s_1.offset = (int)bVar1;
              Section::~Section((Section *)local_1a8);
              goto joined_r0x001f9e6f;
            }
          }
          else if (cVar2 == 'd') {
            if (this->type != QTime) {
              s_6.offset = countRepeat(fmt,local_5c,4);
              s_6.currentIndex = 0x20;
              if (s_6.offset == 3) {
                s_6.currentIndex = 0x40;
              }
              else if (s_6.offset == 4) {
                s_6.currentIndex = 0x80;
              }
              Section::Section((Section *)local_2d0,s_6.currentIndex);
              local_2d0[4] = -(s_6.offset == 2) & 1;
              local_5c = s_6.offset + -1 + local_5c;
              bVar1 = yearSectIndex != -1;
              if (bVar1) {
                QMessageLogger::QMessageLogger(&local_2f0,(char *)0x0,0,(char *)0x0);
                QMessageLogger::warning
                          ((char *)&local_2f0,"DateTimeParser: redefinition of the days section.");
                this_local._7_1_ = 0;
              }
              else {
                qVar6 = QList<QtMWidgets::Section>::size((QList<QtMWidgets::Section> *)local_58);
                yearSectIndex = (int)qVar6;
                QList<QtMWidgets::Section>::append
                          ((QList<QtMWidgets::Section> *)local_58,(parameter_type)local_2d0);
              }
              s_1.offset = (int)bVar1;
              Section::~Section((Section *)local_2d0);
              goto joined_r0x001f9e6f;
            }
          }
          else if (cVar2 == 'h') {
            if (this->type != QDate) {
              iVar3 = countRepeat(fmt,local_5c,2);
              s.offset = (uint)(minuteSectIndex == -1) * 8 + Hour12Section;
              Section::Section((Section *)local_a8,s.offset);
              local_a8[4] = -(iVar3 == 2) & 1;
              local_5c = iVar3 + -1 + local_5c;
              bVar1 = monthSectIndex != -1;
              if (bVar1) {
                QMessageLogger::QMessageLogger((QMessageLogger *)&count_1,(char *)0x0,0,(char *)0x0)
                ;
                QMessageLogger::warning
                          ((char *)&count_1,"DateTimeParser: redefinition of the hours section.");
                this_local._7_1_ = 0;
              }
              else {
                qVar6 = QList<QtMWidgets::Section>::size((QList<QtMWidgets::Section> *)local_58);
                monthSectIndex = (int)qVar6;
                QList<QtMWidgets::Section>::append
                          ((QList<QtMWidgets::Section> *)local_58,(parameter_type)local_a8);
              }
              s_1.offset = (int)bVar1;
              Section::~Section((Section *)local_a8);
              goto joined_r0x001f9e6f;
            }
          }
          else if (cVar2 == 'm') {
            if (this->type != QDate) {
              s_1.currentIndex = countRepeat(fmt,local_5c,2);
              Section::Section((Section *)local_100,MinuteSection);
              local_100[4] = -(s_1.currentIndex == 2) & 1;
              local_5c = s_1.currentIndex + -1 + local_5c;
              bVar1 = daySectIndex != -1;
              if (bVar1) {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)&stack0xfffffffffffffee0,(char *)0x0,0,(char *)0x0);
                QMessageLogger::warning
                          (&stack0xfffffffffffffee0,
                           "DateTimeParser: redefinition of the minutes section");
                this_local._7_1_ = 0;
              }
              else {
                qVar6 = QList<QtMWidgets::Section>::size((QList<QtMWidgets::Section> *)local_58);
                daySectIndex = (int)qVar6;
                QList<QtMWidgets::Section>::append
                          ((QList<QtMWidgets::Section> *)local_58,(parameter_type)local_100);
              }
              s_1.offset = (int)bVar1;
              Section::~Section((Section *)local_100);
              goto joined_r0x001f9e6f;
            }
          }
          else if (cVar2 == 's') {
            if (this->type != QDate) {
              s_2.offset = countRepeat(fmt,local_5c,2);
              Section::Section((Section *)local_158,SecondSection);
              local_158[4] = -(s_2.offset == 2) & 1;
              local_5c = s_2.offset + -1 + local_5c;
              bVar1 = hourSectIndex != -1;
              if (bVar1) {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)&s_3.currentIndex,(char *)0x0,0,(char *)0x0);
                QMessageLogger::warning
                          ((char *)&s_3.currentIndex,
                           "DateTimeParser: redefinition of the seconds section.");
                this_local._7_1_ = 0;
              }
              else {
                qVar6 = QList<QtMWidgets::Section>::size((QList<QtMWidgets::Section> *)local_58);
                hourSectIndex = (int)qVar6;
                QList<QtMWidgets::Section>::append
                          ((QList<QtMWidgets::Section> *)local_58,(parameter_type)local_158);
              }
              s_1.offset = (int)bVar1;
              Section::~Section((Section *)local_158);
              goto joined_r0x001f9e6f;
            }
          }
          else {
            if (cVar2 != 'y') {
              QMessageLogger::QMessageLogger(&local_310,(char *)0x0,0,(char *)0x0);
              QMessageLogger::warning
                        ((char *)&local_310,
                         "DateTimeParser: prohibited character in the format string.");
              this_local._7_1_ = 0;
              s_1.offset = 1;
              goto LAB_001f9eff;
            }
            if (this->type != QTime) {
              s_4.offset = countRepeat(fmt,local_5c,4);
              if ((1 < s_4.offset) && (s_4.offset != 3)) {
                s_4.currentIndex = (uint)(s_4.offset == 2) * 0x800 + YearSection;
                Section::Section((Section *)local_200,s_4.currentIndex);
                local_5c = s_4.offset + -1 + local_5c;
                bVar1 = (int)newSections.d.size != -1;
                if (bVar1) {
                  QMessageLogger::QMessageLogger(&local_220,(char *)0x0,0,(char *)0x0);
                  QMessageLogger::warning
                            ((char *)&local_220,"DateTimeParser: redefinition of the years section."
                            );
                  this_local._7_1_ = 0;
                }
                else {
                  qVar6 = QList<QtMWidgets::Section>::size((QList<QtMWidgets::Section> *)local_58);
                  newSections.d.size._0_4_ = (int)qVar6;
                  QList<QtMWidgets::Section>::append
                            ((QList<QtMWidgets::Section> *)local_58,(parameter_type)local_200);
                }
                s_1.offset = (int)bVar1;
                Section::~Section((Section *)local_200);
                goto joined_r0x001f9e6f;
              }
              QMessageLogger::QMessageLogger((QMessageLogger *)&t_2,(char *)0x0,0,(char *)0x0);
              QMessageLogger::warning
                        ((char *)&t_2,"DateTimeParser: wrong value of the years section.");
              this_local._7_1_ = 0;
              s_1.offset = 1;
              goto LAB_001f9eff;
            }
          }
        }
      }
      QList<QtMWidgets::Section>::swap(&this->sections,(QList<QtMWidgets::Section> *)local_58);
      QString::operator=(&this->format,(QString *)fmt);
      this_local._7_1_ = 1;
      s_1.offset = 1;
LAB_001f9eff:
      QList<QtMWidgets::Section>::~QList((QList<QtMWidgets::Section> *)local_58);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
DateTimeParser::parseFormat( const QString & fmt )
{
	if( fmt.isEmpty() )
		return false;

	if( fmt == format )
		return true;

	const int max = fmt.size();

	int amPmSectIndex = -1;
	int secondSectIndex = -1;
	int minuteSectIndex = -1;
	int hourSectIndex = -1;
	int daySectIndex = -1;
	int monthSectIndex = -1;
	int yearSectIndex = -1;

	QVector< Section > newSections;

	for( int i = 0; i < max; ++i )
	{
		switch( fmt.at( i ).toLatin1() )
		{
			case 'h' :
			{
				if( type != QMetaType::QDate )
				{
					const int count = countRepeat( fmt, i, 2 );

					Section::Type t = ( amPmSectIndex != -1 ) ?
						Section::Hour12Section : Section::Hour24Section;

					Section s( t );
					s.zeroesAdded = ( count == 2 ) ? true : false;

					i += ( count - 1 );

					if( hourSectIndex == -1 )
					{
						hourSectIndex = newSections.size();
						newSections.append( s );
					}
					else
					{
						qWarning( "DateTimeParser: redefinition of the hours section." );
						return false;
					}
				}
			} break;

			case 'm' :
			{
				if( type != QMetaType::QDate )
				{
					const int count = countRepeat( fmt, i, 2 );

					Section s( Section::MinuteSection );
					s.zeroesAdded = ( count == 2 ) ? true : false;

					i += ( count - 1 );

					if( minuteSectIndex == -1 )
					{
						minuteSectIndex = newSections.size();
						newSections.append( s );
					}
					else
					{
						qWarning( "DateTimeParser: redefinition of the minutes section" );
						return false;
					}
				}
			} break;

			case 's' :
			{
				if( type != QMetaType::QDate )
				{
					const int count = countRepeat( fmt, i, 2 );

					Section s( Section::SecondSection );
					s.zeroesAdded = ( count == 2 ) ? true : false;

					i += ( count - 1 );

					if( secondSectIndex == -1 )
					{
						secondSectIndex = newSections.size();
						newSections.append( s );
					}
					else
					{
						qWarning( "DateTimeParser: redefinition of the seconds section." );
						return false;
					}
				}
			} break;

			case 'a' :
			{
				if( type != QMetaType::QDate )
				{
					Section s( Section::AmPmSection );

					if( hourSectIndex != -1 )
						newSections[ hourSectIndex ].type = Section::Hour12Section;

					if( amPmSectIndex == -1 )
					{
						amPmSectIndex = newSections.size();
						newSections.append( s );
					}
					else
					{
						qWarning( "DateTimeParser: redefinition of the AM/PM section." );
						return false;
					}
				}
			} break;

			case 'y' :
			{
				if( type != QMetaType::QTime )
				{
					const int count = countRepeat( fmt, i, 4 );

					if( count >= 2 && count != 3 )
					{
						Section::Type t = ( count == 2 ?
							Section::YearSection2Digits : Section::YearSection );
						Section s( t );

						i += ( count - 1 );

						if( yearSectIndex == -1 )
						{
							yearSectIndex = newSections.size();
							newSections.append( s );
						}
						else
						{
							qWarning( "DateTimeParser: redefinition of the years section." );
							return false;
						}
					}
					else
					{
						qWarning( "DateTimeParser: wrong value of the years section." );
						return false;
					}
				}
			} break;

			case 'M' :
			{
				if( type != QMetaType::QTime )
				{
					const int count = countRepeat( fmt, i, 4 );

					Section::Type t = Section::MonthSection;

					if( count == 3 )
						t = Section::MonthSectionShort;
					else if( count == 4 )
						t = Section::MonthSectionLong;

					Section s( t );
					s.zeroesAdded = ( count == 2 ) ? true : false;

					i += ( count - 1 );

					if( monthSectIndex == -1 )
					{
						monthSectIndex = newSections.size();
						newSections.append( s );
					}
					else
					{
						qWarning( "DateTimeParser: redefinition of the monthes section." );
						return false;
					}
				}
			} break;

			case 'd' :
			{
				if( type != QMetaType::QTime )
				{
					const int count = countRepeat( fmt, i, 4 );

					Section::Type t = Section::DaySection;

					if( count == 3 )
						t = Section::DaySectionShort;
					else if( count == 4 )
						t = Section::DaySectionLong;

					Section s( t );
					s.zeroesAdded = ( count == 2 ) ? true : false;

					i += ( count - 1 );

					if( daySectIndex == -1 )
					{
						daySectIndex = newSections.size();
						newSections.append( s );
					}
					else
					{
						qWarning( "DateTimeParser: redefinition of the days section." );
						return false;
					}
				}
			} break;

			case ' ' :
				break;

			default :
			{
				qWarning( "DateTimeParser: prohibited character in the format string." );
				return false;
			}
		}
	}

	sections.swap( newSections );
	format = fmt;

	return true;
}